

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::GenerateMembers
          (ImmutableMessageOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_ImmutableMessageFieldGenerator).variables_;
  PrintExtraFieldInfo(variables,printer);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableMessageFieldGenerator).descriptor_,HAZZER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableMessageFieldGenerator).descriptor_,GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n     return ($type$) $oneof_name$_;\n  }\n  return $type$.getDefaultInstance();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldGenerator).descriptor_);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$() {\n  if ($has_oneof_case_message$) {\n     return ($type$) $oneof_name$_;\n  }\n  return $type$.getDefaultInstance();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableMessageOneofFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "     return ($type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $type$.getDefaultInstance();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$OrBuilder "
                 "${$get$capitalized_name$OrBuilder$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "     return ($type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $type$.getDefaultInstance();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
}